

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
google::anon_unknown_8::LogCleaner::GetOverdueLogNames
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,LogCleaner *this,string *log_directory,time_point *current_time,
          string *base_filename,string *filename_extension)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  DIR *__dirp;
  dirent *pdVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  char *dir_delim_end;
  undefined1 local_80 [8];
  string filepath;
  dirent *ent;
  DIR *dir;
  string *filename_extension_local;
  string *base_filename_local;
  time_point *current_time_local;
  string *log_directory_local;
  LogCleaner *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *overdue_log_names;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar3);
  if (__dirp != (DIR *)0x0) {
    while (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0) {
      iVar2 = strcmp(pdVar4->d_name,".");
      if ((iVar2 != 0) && (iVar2 = strcmp(pdVar4->d_name,".."), iVar2 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_80,pdVar4->d_name,(allocator<char> *)((long)&dir_delim_end + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&dir_delim_end + 7));
        local_90 = "N6google4base6LoggerE";
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::__cxx11::string::size();
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)log_directory);
          pcVar3 = std::find<char_const*,char>
                             ("/N6google4base6LoggerE","N6google4base6LoggerE",pcVar3);
          if (pcVar3 != "N6google4base6LoggerE") {
            std::operator+(&local_b0,log_directory,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80);
            std::__cxx11::string::operator=((string *)local_80,(string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
          }
        }
        bVar1 = IsLogFromCurrentProject(this,(string *)local_80,base_filename,filename_extension);
        if ((bVar1) && (bVar1 = IsLogLastModifiedOver(this,(string *)local_80,current_time), bVar1))
        {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)local_80);
        }
        std::__cxx11::string::~string((string *)local_80);
      }
    }
    closedir(__dirp);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> LogCleaner::GetOverdueLogNames(
    string log_directory,
    const std::chrono::system_clock::time_point& current_time,
    const string& base_filename, const string& filename_extension) const {
  // The names of overdue logs.
  vector<string> overdue_log_names;

  // Try to get all files within log_directory.
  DIR* dir;
  struct dirent* ent;

  if ((dir = opendir(log_directory.c_str()))) {
    while ((ent = readdir(dir))) {
      if (strcmp(ent->d_name, ".") == 0 || strcmp(ent->d_name, "..") == 0) {
        continue;
      }

      string filepath = ent->d_name;
      const char* const dir_delim_end =
          possible_dir_delim + sizeof(possible_dir_delim);

      if (!log_directory.empty() &&
          std::find(possible_dir_delim, dir_delim_end,
                    log_directory[log_directory.size() - 1]) != dir_delim_end) {
        filepath = log_directory + filepath;
      }

      if (IsLogFromCurrentProject(filepath, base_filename,
                                  filename_extension) &&
          IsLogLastModifiedOver(filepath, current_time)) {
        overdue_log_names.push_back(filepath);
      }
    }
    closedir(dir);
  }

  return overdue_log_names;
}